

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O0

void Abc_NtkSymmetries(Abc_Ntk_t *pNtk,int fUseBdds,int fNaive,int fReorder,int fVerbose)

{
  int fVerbose_local;
  int fReorder_local;
  int fNaive_local;
  int fUseBdds_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((fUseBdds == 0) && (fNaive == 0)) {
    Abc_NtkSymmetriesUsingSandS(pNtk,fVerbose);
  }
  else {
    Abc_NtkSymmetriesUsingBdds(pNtk,fNaive,fReorder,fVerbose);
  }
  return;
}

Assistant:

void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose )
{
    if ( fUseBdds || fNaive )
        Abc_NtkSymmetriesUsingBdds( pNtk, fNaive, fReorder, fVerbose );
    else
        Abc_NtkSymmetriesUsingSandS( pNtk, fVerbose );
}